

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

Interval * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::Div::innerExtrema
          (Interval *__return_storage_ptr__,Div *this,EvalContext *param_1,Interval *nom,
          Interval *den)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  
  __return_storage_ptr__->m_hasNaN = false;
  __return_storage_ptr__->m_lo = INFINITY;
  __return_storage_ptr__->m_hi = -INFINITY;
  if ((den->m_lo <= 0.0) && (0.0 <= den->m_hi)) {
    dVar1 = nom->m_lo;
    dVar2 = nom->m_hi;
    bVar3 = false;
    if ((dVar1 <= 0.0) && (bVar3 = false, 0.0 <= dVar2)) {
      __return_storage_ptr__->m_hasNaN = true;
      __return_storage_ptr__->m_hi = -INFINITY;
      bVar3 = true;
    }
    if ((dVar1 < 0.0) || (0.0 < dVar2)) {
      __return_storage_ptr__->m_hasNaN = bVar3;
      __return_storage_ptr__->m_lo = -INFINITY;
      __return_storage_ptr__->m_hi = INFINITY;
      return __return_storage_ptr__;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Interval	innerExtrema	(const EvalContext&,
								 const Interval&		nom,
								 const Interval&		den) const
	{
		Interval ret;

		if (den.contains(0.0))
		{
			if (nom.contains(0.0))
				ret |= TCU_NAN;

			if (nom.lo() < 0.0 || nom.hi() > 0.0)
				ret |= Interval::unbounded();
		}

		return ret;
	}